

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::JsonReporter::testCasePartialEnded
          (JsonReporter *this,TestCaseStats *tcStats,uint64_t param_2)

{
  StringRef value;
  StringRef value_00;
  _Elt_pointer pJVar1;
  JsonObjectWriter totals;
  char local_1e9;
  JsonObjectWriter local_1e8;
  JsonObjectWriter local_1d0;
  undefined1 local_1b8 [400];
  uint64_t local_28;
  
  std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>::pop_back
            (&(this->m_arrayWriters).c);
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::pop_back
            (&(this->m_writers).c);
  if ((tcStats->stdOut)._M_string_length != 0) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pJVar1 == (this->m_objectWriters).c.
                  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pJVar1 = (this->m_objectWriters).c.
               super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    JsonObjectWriter::write((JsonObjectWriter *)local_1b8,(int)pJVar1 + -0x18,"captured-stdout",0xf)
    ;
    value.m_start = (tcStats->stdOut)._M_dataplus._M_p;
    value.m_size = (tcStats->stdOut)._M_string_length;
    JsonValueWriter::writeImpl((JsonValueWriter *)local_1b8,value,true);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x88));
  }
  if ((tcStats->stdErr)._M_string_length != 0) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pJVar1 == (this->m_objectWriters).c.
                  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pJVar1 = (this->m_objectWriters).c.
               super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    JsonObjectWriter::write((JsonObjectWriter *)local_1b8,(int)pJVar1 + -0x18,"captured-stderr",0xf)
    ;
    value_00.m_start = (tcStats->stdErr)._M_dataplus._M_p;
    value_00.m_size = (tcStats->stdErr)._M_string_length;
    JsonValueWriter::writeImpl((JsonValueWriter *)local_1b8,value_00,true);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x88));
  }
  pJVar1 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)local_1b8,(int)pJVar1 + -0x18,"totals",6);
  local_1d0.m_os = (ostream *)local_1b8._0_8_;
  local_1d0.m_indent_level = local_28;
  local_1d0.m_should_comma = false;
  local_1d0.m_active = true;
  local_1e8.m_os = (ostream *)CONCAT71(local_1e8.m_os._1_7_,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8._0_8_,(char *)&local_1e8,1);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1b8,(int)&local_1d0,"assertions",10);
  local_1e8.m_os = (ostream *)local_1b8._0_8_;
  local_1e8.m_indent_level = local_28;
  local_1e8.m_should_comma = false;
  local_1e8.m_active = true;
  local_1e9 = '{';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8._0_8_,&local_1e9,1);
  writeCounts(&local_1e8,&(tcStats->totals).assertions);
  JsonObjectWriter::~JsonObjectWriter(&local_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x88));
  JsonObjectWriter::~JsonObjectWriter(&local_1d0);
  std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>::pop_back
            (&(this->m_objectWriters).c);
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::pop_back
            (&(this->m_writers).c);
  return;
}

Assistant:

void JsonReporter::testCasePartialEnded( TestCaseStats const& tcStats,
                                             uint64_t /*index*/ ) {
        // Fixme: the top level section handles this.
        //// path object
        endArray();
        if ( !tcStats.stdOut.empty() ) {
            m_objectWriters.top()
                .write( "captured-stdout"_sr )
                .write( tcStats.stdOut );
        }
        if ( !tcStats.stdErr.empty() ) {
            m_objectWriters.top()
                .write( "captured-stderr"_sr )
                .write( tcStats.stdErr );
        }
        {
            auto totals =
                m_objectWriters.top().write( "totals"_sr ).writeObject();
            writeCounts( totals.write( "assertions"_sr ).writeObject(),
                         tcStats.totals.assertions );
            // We do not write the test case totals, because there will
            // always be just one test case here.
            // TODO: overall "result" -> success, skip, fail here? Or in
            // partial result?
        }
        // TODO: aborting?
        // run object
        endObject();
    }